

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void write<unsigned_long>
               (vector<char,_std::allocator<char>_> *buffer,size_t *position,unsigned_long *x,
               size_t count)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  char *pcVar2;
  vector<char,_std::allocator<char>_> *in_RCX;
  long in_RDX;
  size_type *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char *x_ptr;
  _Tp_alloc_type *p_Var3;
  _Tp_alloc_type *p_Var4;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  size_type in_stack_ffffffffffffffd8;
  
  p_Var3 = &(in_RCX->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Tp_alloc_type +
           *in_RSI;
  pvVar1 = (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::capacity(in_RDI);
  if (pvVar1 < p_Var3) {
    p_Var4 = &(in_RCX->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Tp_alloc_type
             + *in_RSI;
    in_stack_ffffffffffffffc8 = (float)(long)p_Var4;
    in_stack_ffffffffffffffcc = (float)p_Var4;
    in_stack_ffffffffffffffc0 = in_RDI;
    std::vector<char,_std::allocator<char>_>::reserve(in_RCX,in_stack_ffffffffffffffd8);
  }
  p_Var4 = &(in_RCX->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Tp_alloc_type +
           *in_RSI;
  pcVar2 = (char *)std::vector<char,_std::allocator<char>_>::size(in_RDI);
  if (pcVar2 < p_Var4) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)p_Var3,
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  p_Var3 = &(in_RCX->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Tp_alloc_type +
           in_RDX;
  std::vector<char,_std::allocator<char>_>::operator[](in_RDI,*in_RSI);
  std::copy<char_const*,char*>((char *)in_stack_ffffffffffffffc0,(char *)p_Var4,(char *)p_Var3);
  *in_RSI = (size_type)
            (&(in_RCX->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Tp_alloc_type
            + *in_RSI);
  return;
}

Assistant:

void write(std::vector<char>& buffer, size_t& position, const T& x, size_t count = sizeof(T))
{
    if (position + count > buffer.capacity())
        buffer.reserve((position + count) * growth_multiplier);         // if we have to grow, grow geometrically

    if (position + count > buffer.size())
        buffer.resize(position + count);

    const char* x_ptr = (const char*) &x;
    std::copy(x_ptr, x_ptr + count, &buffer[position]);
    position += count;
}